

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

void __thiscall Mat::Print(Mat *this,char *title)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  
  puts(title);
  if (0 < this->n_rows_) {
    iVar3 = 0;
    do {
      uVar1 = this->n_cols_;
      uVar2 = (ulong)uVar1;
      if (1 < (int)uVar1) {
        lVar4 = 0;
        do {
          printf("%+5.2f ",this->v_[(int)uVar2 * iVar3 + lVar4]);
          lVar4 = lVar4 + 1;
          uVar1 = this->n_cols_;
          uVar2 = (ulong)(int)uVar1;
        } while (lVar4 < (long)(uVar2 - 1));
      }
      printf("%+5.2f\n",this->v_[(long)(int)(uVar1 * iVar3) + (long)(int)uVar1 + -1]);
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->n_rows_);
  }
  return;
}

Assistant:

void Mat::Print(const char *title){
  printf("%s\n", title);
  for (int i=0; i<n_rows_; i++){
    for (int j=0; j<n_cols_-1; j++){
      printf("%+5.2f ", *(v_+i*n_cols_ + j));
    }
    printf("%+5.2f\n", *(v_+i*n_cols_ + n_cols_-1));
  }
}